

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::GridSample_x86_avx512::forward
          (GridSample_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mat *src;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  pointer dst;
  int iVar22;
  uint uVar23;
  pointer opt_00;
  long lVar24;
  undefined8 *puVar25;
  int iVar26;
  void *pvVar27;
  long lVar28;
  long lVar29;
  undefined1 (*pauVar30) [32];
  int *offset_ptr;
  int *piVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 in_ZMM11 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  Mat local_e8;
  size_t local_98;
  int local_8c;
  Mat local_88;
  pointer local_38;
  
  auVar50 = in_ZMM11._0_16_;
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  local_38 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_8c = src->elempack;
  iVar4 = src->c;
  iVar22 = src->dims;
  local_98 = src->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (int *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8._20_8_ = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  opt_00 = (pointer)&local_88.dims;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88.elemsize._4_4_ = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  if (src[1].elempack == 1) {
    if (&local_88 != src + 1) {
      piVar31 = src[1].refcount;
      if (piVar31 != (int *)0x0) {
        LOCK();
        *piVar31 = *piVar31 + 1;
        UNLOCK();
      }
      local_e8.cstep = 0;
      local_e8.c = 0;
      local_e8.d = 0;
      local_e8.h = 0;
      local_e8.w = 0;
      local_e8.dims = 0;
      local_e8.allocator = (Allocator *)0x0;
      local_e8._20_8_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.refcount._0_4_ = 0;
      local_e8.data = (int *)0x0;
      local_88.data = src[1].data;
      local_88.refcount._0_4_ = SUB84(src[1].refcount,0);
      local_88.refcount._4_4_ = (undefined4)((ulong)src[1].refcount >> 0x20);
      local_88.elemsize._0_4_ = (undefined4)src[1].elemsize;
      local_88.elemsize._4_4_ = (undefined4)(src[1].elemsize >> 0x20);
      local_88.elempack = src[1].elempack;
      local_88.allocator = src[1].allocator;
      uVar17 = src[1].dims;
      uVar18 = src[1].w;
      uVar19 = src[1].h;
      uVar20 = src[1].d;
      local_88.c = src[1].c;
      local_88.cstep = src[1].cstep;
      local_88.dims = uVar17;
      local_88.w = uVar18;
      local_88.h = uVar19;
      local_88.d = uVar20;
    }
  }
  else {
    opt_00 = (pointer)opt;
    convert_packing(src + 1,&local_88,1,opt);
  }
  if (iVar22 == 3) {
    iVar6 = local_88.h;
    iVar21 = local_88.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar6 = local_88.c;
      iVar21 = local_88.h;
    }
    Mat::create(local_38,iVar21,iVar6,iVar4,local_98,local_8c,opt->blob_allocator);
    iVar26 = -100;
    if ((local_38->data == (void *)0x0) || ((long)local_38->c * local_38->cstep == 0))
    goto LAB_005e6a87;
    opt_00 = local_38;
    if ((this->super_GridSample).sample_type == 1) {
      Mat::create(&local_e8,iVar21,iVar6,local_98 * 6,6,opt->workspace_allocator);
      if (((int *)local_e8.data == (int *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_005e6a87;
      iVar5 = (this->super_GridSample).padding_mode;
      if (iVar5 == 3) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else if (iVar5 == 2) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else {
        if (iVar5 != 1) {
          forward();
          goto LAB_005e6a87;
        }
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 2) {
      Mat::create(&local_e8,iVar21,iVar6,1,local_98,1,opt->workspace_allocator);
      if (((int *)local_e8.data == (int *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_005e6a87;
      iVar5 = (this->super_GridSample).padding_mode;
      if (iVar5 == 3) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else if (iVar5 == 2) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else {
        if (iVar5 != 1) {
          forward();
          goto LAB_005e6a87;
        }
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create(&local_e8,iVar21,iVar6,local_98 * 0x12,0x12,opt->workspace_allocator);
      if (((int *)local_e8.data == (int *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_005e6a87;
      iVar6 = (this->super_GridSample).padding_mode;
      if (iVar6 == 3) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else if (iVar6 == 2) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else {
        if (iVar6 != 1) {
          forward();
          goto LAB_005e6a87;
        }
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
    }
  }
  if (iVar22 == 4) {
    iVar6 = local_88.d;
    iVar21 = local_88.w;
    iVar5 = local_88.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar6 = local_88.c;
      iVar21 = local_88.h;
      iVar5 = local_88.d;
    }
    Mat::create(local_38,iVar21,iVar5,iVar6,iVar4,local_98,local_8c,opt->blob_allocator);
    iVar26 = -100;
    if ((local_38->data == (void *)0x0) || ((long)local_38->c * local_38->cstep == 0))
    goto LAB_005e6a87;
    opt_00 = local_38;
    if ((this->super_GridSample).sample_type == 1) {
      Mat::create(&local_e8,iVar21,iVar5,iVar6,local_98 * 0xb,0xb,opt->workspace_allocator);
      if (((int *)local_e8.data == (int *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_005e6a87;
      iVar4 = (this->super_GridSample).padding_mode;
      if (iVar4 == 3) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else if (iVar4 == 2) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else {
        if (iVar4 != 1) {
          forward();
          goto LAB_005e6a87;
        }
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 2) {
      Mat::create(&local_e8,iVar21,iVar5,iVar6,1,local_98,1,opt->workspace_allocator);
      if (((int *)local_e8.data == (int *)0x0) || ((long)local_e8.c * local_e8.cstep == 0))
      goto LAB_005e6a87;
      iVar4 = (this->super_GridSample).padding_mode;
      if (iVar4 == 3) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else if (iVar4 == 2) {
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
      else {
        if (iVar4 != 1) {
          forward();
          goto LAB_005e6a87;
        }
        uVar23 = (this->super_GridSample).permute_fusion;
        opt_00 = (pointer)(ulong)uVar23;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_88,&local_e8,uVar23);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_88,&local_e8,uVar23);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      forward();
      goto LAB_005e6a87;
    }
  }
  dst = local_38;
  iVar4 = local_8c;
  iVar26 = 0;
  if (local_8c < 8) {
    if (local_8c == 1) {
      if (iVar22 == 3) {
        iVar4 = (this->super_GridSample).sample_type;
        if (iVar4 == 3) {
          iVar4 = local_38->c;
          if (0 < (long)iVar4) {
            uVar23 = local_38->h * local_38->w;
            pvVar7 = src->data;
            sVar8 = src->elemsize;
            sVar9 = src->cstep;
            pvVar27 = local_38->data;
            lVar28 = local_38->elemsize * local_38->cstep;
            lVar24 = 0;
            auVar49 = SUB6416(ZEXT464(0x3f800000),0);
            auVar52 = vpmovsxbd_avx(ZEXT416(0xc080400));
            auVar13 = vpmovsxbd_avx(ZEXT416(0xd090501));
            auVar14 = vpmovsxbd_avx(ZEXT416(0xe0a0602));
            auVar15 = vpmovsxbd_avx(ZEXT416(0xf0b0703));
            auVar50 = vpcmpeqd_avx(auVar50,auVar50);
            auVar54._8_4_ = 0x3fa00000;
            auVar54._0_8_ = 0x3fa000003fa00000;
            auVar54._12_4_ = 0x3fa00000;
            auVar55._8_4_ = 0xc0100000;
            auVar55._0_8_ = 0xc0100000c0100000;
            auVar55._12_4_ = 0xc0100000;
            auVar56._8_4_ = 0x3f800000;
            auVar56._0_8_ = 0x3f8000003f800000;
            auVar56._12_4_ = 0x3f800000;
            iVar26 = 0;
            do {
              if (0 < (int)uVar23) {
                puVar25 = (undefined8 *)(sVar8 * sVar9 * lVar24 + (long)pvVar7);
                lVar29 = 0;
                pauVar30 = (undefined1 (*) [32])((long)local_e8.data + 8);
                do {
                  uVar2 = *(uint *)(pauVar30[-1] + 0x18);
                  uVar3 = *(uint *)(pauVar30[-1] + 0x1c);
                  auVar32 = vaddss_avx512f(ZEXT416(uVar3),auVar49);
                  auVar33 = vsubss_avx512f(auVar49,ZEXT416(uVar3));
                  auVar34 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416(uVar2));
                  auVar35 = vfmsub213ss_avx512f(SUB6416(ZEXT464(0x3f400000),0),auVar32,
                                                SUB6416(ZEXT464(0x40700000),0));
                  auVar39 = ZEXT416(uVar2);
                  auVar36 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0x3fa00000),0),auVar39,
                                                SUB6416(ZEXT464(0xc0100000),0));
                  auVar37 = vsubss_avx512f(auVar49,auVar39);
                  auVar38 = vmulss_avx512f(auVar37,auVar37);
                  auVar37 = vfmadd213ss_avx512f(auVar37,SUB6416(ZEXT464(0x3fa00000),0),
                                                SUB6416(ZEXT464(0xc0100000),0));
                  auVar39 = vaddss_avx512f(auVar39,auVar49);
                  auVar40 = vmulss_avx512f(auVar39,auVar39);
                  auVar41 = vfmsub213ss_avx512f(SUB6416(ZEXT464(0x3f400000),0),auVar39,
                                                SUB6416(ZEXT464(0x40700000),0));
                  auVar39 = vfmsub213ss_avx512f(auVar39,SUB6416(ZEXT464(0x40c00000),0),
                                                SUB6416(ZEXT464(0x40400000),0));
                  auVar44 = vmovdqu64_avx512vl(pauVar30[1]);
                  auVar34 = vfmadd213ss_avx512f(auVar36,auVar34,auVar49);
                  auVar45 = vmovdqu64_avx512vl(*pauVar30);
                  auVar46 = vmovdqa64_avx512vl(auVar45);
                  auVar46 = vpermt2d_avx512vl(auVar46,ZEXT1632(auVar52),auVar44);
                  auVar36 = vfnmsub231ss_avx512f(auVar39,auVar40,auVar41);
                  auVar47 = vmovdqa64_avx512vl(auVar45);
                  auVar47 = vpermt2d_avx512vl(auVar47,ZEXT1632(auVar13),auVar44);
                  auVar48 = vmovdqa64_avx512vl(auVar45);
                  auVar37 = vmulss_avx512f(auVar38,auVar37);
                  auVar48 = vpermt2d_avx512vl(auVar48,ZEXT1632(auVar14),auVar44);
                  auVar44 = vpermt2d_avx512vl(auVar45,ZEXT1632(auVar15),auVar44);
                  auVar39 = auVar46._0_16_;
                  uVar16 = vpcmpgtd_avx512vl(auVar39,auVar50);
                  auVar38 = vaddss_avx512f(auVar34,auVar37);
                  vpmovzxdq_avx512vl(auVar39);
                  auVar39 = vpxord_avx512vl(auVar39,auVar39);
                  auVar40 = vgatherqps_avx512vl(*(undefined8 *)((long)puVar25 + (ulong)uVar23 * 4));
                  bVar12 = (bool)((byte)(uVar16 & 0xf) & 1);
                  auVar41._0_8_ = (ulong)bVar12 * auVar40._0_8_ | (ulong)!bVar12 * auVar39._0_8_;
                  bVar12 = (bool)((byte)((uVar16 & 0xf) >> 1) & 1);
                  auVar41._8_8_ = (ulong)bVar12 * auVar40._8_8_ | (ulong)!bVar12 * auVar39._8_8_;
                  auVar37 = vaddss_avx512f(auVar37,auVar49);
                  auVar39 = vbroadcastss_avx512vl(auVar36);
                  auVar34 = vbroadcastss_avx512vl(auVar34);
                  uVar16 = vpcmpgtd_avx512vl(auVar47._0_16_,auVar50);
                  auVar39 = vmulps_avx512vl(auVar41,auVar39);
                  auVar45 = vpmovzxdq_avx512vl(auVar47._0_16_);
                  auVar40 = vxorps_avx512vl(auVar41,auVar41);
                  auVar41 = vgatherqps_avx512vl(*(undefined8 *)((long)puVar25 + lVar28 * 4));
                  bVar12 = (bool)((byte)(uVar16 & 0xf) & 1);
                  auVar42._0_8_ = (ulong)bVar12 * auVar41._0_8_ | (ulong)!bVar12 * auVar40._0_8_;
                  bVar12 = (bool)((byte)((uVar16 & 0xf) >> 1) & 1);
                  auVar42._8_8_ = (ulong)bVar12 * auVar41._8_8_ | (ulong)!bVar12 * auVar40._8_8_;
                  auVar36 = vaddss_avx512f(auVar38,auVar36);
                  uVar16 = vpcmpgtd_avx512vl(auVar48._0_16_,auVar50);
                  vpmovzxdq_avx512vl(auVar48._0_16_);
                  auVar38 = vxorps_avx512vl(auVar45._0_16_,auVar45._0_16_);
                  auVar34 = vfmadd213ps_avx512vl(auVar42,auVar34,auVar39);
                  auVar40 = vgatherqps_avx512vl(*(undefined8 *)((long)puVar25 + (long)pvVar27 * 4));
                  bVar12 = (bool)((byte)(uVar16 & 0xf) & 1);
                  auVar39._0_8_ = (ulong)bVar12 * auVar40._0_8_ | (ulong)!bVar12 * auVar38._0_8_;
                  bVar12 = (bool)((byte)((uVar16 & 0xf) >> 1) & 1);
                  auVar39._8_8_ = (ulong)bVar12 * auVar40._8_8_ | (ulong)!bVar12 * auVar38._8_8_;
                  uVar16 = vpcmpgtd_avx512vl(auVar44._0_16_,auVar50);
                  vpmovzxdq_avx512vl(auVar44._0_16_);
                  auVar38 = vbroadcastss_avx512vl(auVar37);
                  auVar37 = vxorps_avx512vl(auVar37,auVar37);
                  auVar40 = vgatherqps_avx512vl(*puVar25);
                  bVar12 = (bool)((byte)(uVar16 & 0xf) & 1);
                  auVar43._0_8_ = (ulong)bVar12 * auVar40._0_8_ | (ulong)!bVar12 * auVar37._0_8_;
                  bVar12 = (bool)((byte)((uVar16 & 0xf) >> 1) & 1);
                  auVar43._8_8_ = (ulong)bVar12 * auVar40._8_8_ | (ulong)!bVar12 * auVar37._8_8_;
                  auVar36 = vbroadcastss_avx512vl(auVar36);
                  auVar37 = vfmsub213ss_avx512f(SUB6416(ZEXT464(0x40c00000),0),auVar32,
                                                SUB6416(ZEXT464(0x40400000),0));
                  auVar32 = vmulss_avx512f(auVar32,auVar32);
                  auVar35 = vfnmsub213ss_avx512f(auVar32,auVar35,auVar37);
                  auVar34 = vfmadd213ps_avx512vl(auVar39,auVar38,auVar34);
                  auVar32 = vinsertps_avx512f(ZEXT416(uVar3),auVar33,0x10);
                  auVar33 = vmulps_avx512vl(auVar32,auVar32);
                  auVar32 = vfmadd213ps_fma(auVar32,auVar54,auVar55);
                  auVar34 = vfnmadd213ps_avx512vl(auVar43,auVar36,auVar34);
                  auVar32 = vmulps_avx512vl(auVar33,auVar32);
                  auVar33 = vaddps_avx512vl(auVar32,auVar56);
                  auVar32 = vmovshdup_avx(auVar32);
                  auVar32 = vaddss_avx512f(auVar33,auVar32);
                  auVar32 = vaddss_avx512f(auVar32,auVar35);
                  auVar36 = vshufps_avx512vl(auVar34,auVar34,0xe9);
                  auVar33 = vmulps_avx512vl(auVar36,auVar33);
                  auVar35 = vfmadd213ss_avx512f(auVar35,auVar34,auVar33);
                  auVar33 = vmovshdup_avx512vl(auVar33);
                  auVar33 = vaddss_avx512f(auVar35,auVar33);
                  auVar34 = vshufps_avx512vl(auVar34,auVar34,0xff);
                  auVar32 = vfnmadd213ss_avx512f(auVar34,auVar32,auVar33);
                  *(int *)((long)pvVar27 + lVar29 * 4) = auVar32._0_4_;
                  lVar29 = lVar29 + 1;
                  pauVar30 = (undefined1 (*) [32])(pauVar30[2] + 8);
                } while (uVar23 != (uint)lVar29);
              }
              lVar24 = lVar24 + 1;
              pvVar27 = (void *)((long)pvVar27 + lVar28);
            } while (lVar24 != iVar4);
          }
          goto LAB_005e6a87;
        }
        if (iVar4 != 2) {
          iVar26 = 0;
          if ((iVar4 == 1) && (iVar4 = local_38->c, 0 < (long)iVar4)) {
            iVar22 = local_38->h * local_38->w;
            pvVar7 = src->data;
            sVar8 = src->elemsize;
            sVar9 = src->cstep;
            pvVar27 = local_38->data;
            sVar10 = local_38->elemsize;
            sVar11 = local_38->cstep;
            lVar28 = 0;
            iVar26 = 0;
            do {
              if (0 < iVar22) {
                lVar24 = sVar8 * sVar9 * lVar28;
                lVar29 = 0;
                piVar31 = (int *)local_e8.data;
                do {
                  fVar51 = 0.0;
                  auVar50 = ZEXT816(0) << 0x40;
                  if (-1 < (long)*piVar31) {
                    auVar50 = ZEXT416(*(uint *)((long)pvVar7 + (long)*piVar31 * 4 + lVar24));
                  }
                  if (-1 < (long)piVar31[1]) {
                    fVar51 = *(float *)((long)pvVar7 + (long)piVar31[1] * 4 + lVar24);
                  }
                  fVar53 = 0.0;
                  auVar52 = ZEXT816(0) << 0x40;
                  if (-1 < (long)piVar31[2]) {
                    auVar52 = ZEXT416(*(uint *)((long)pvVar7 + (long)piVar31[2] * 4 + lVar24));
                  }
                  if (-1 < (long)piVar31[3]) {
                    fVar53 = *(float *)((long)pvVar7 + (long)piVar31[3] * 4 + lVar24);
                  }
                  fVar1 = (float)piVar31[4];
                  auVar50 = vfmadd213ss_fma(auVar50,ZEXT416((uint)(1.0 - fVar1)),
                                            ZEXT416((uint)(fVar1 * fVar51)));
                  auVar52 = vfmadd213ss_fma(auVar52,ZEXT416((uint)(1.0 - fVar1)),
                                            ZEXT416((uint)(fVar1 * fVar53)));
                  auVar50 = vfmadd132ss_fma(ZEXT416((uint)(auVar52._0_4_ - auVar50._0_4_)),auVar50,
                                            ZEXT416((uint)piVar31[5]));
                  *(int *)((long)pvVar27 + lVar29 * 4) = auVar50._0_4_;
                  piVar31 = piVar31 + 6;
                  lVar29 = lVar29 + 1;
                } while (iVar22 != (int)lVar29);
              }
              lVar28 = lVar28 + 1;
              pvVar27 = (void *)((long)pvVar27 + sVar10 * sVar11);
            } while (lVar28 != iVar4);
          }
          goto LAB_005e6a87;
        }
      }
      else {
        if (iVar22 != 4) goto LAB_005e6a87;
        iVar4 = (this->super_GridSample).sample_type;
        if (iVar4 != 2) {
          if (iVar4 == 1) {
            gridsample_3d_bilinear_apply_interpolation_p1(src,local_38,&local_e8,(Option *)opt_00);
          }
          goto LAB_005e6a87;
        }
      }
      gridsample_nearest_apply_interpolation_p1(src,local_38,&local_e8,(Option *)opt_00);
      goto LAB_005e6a87;
    }
  }
  else {
    if (local_8c != 8) {
      if (local_8c != 0x10) goto LAB_005e6a87;
      if (iVar22 == 3) {
        iVar4 = (this->super_GridSample).sample_type;
        if (iVar4 == 3) {
          gridsample_2d_bicubic_apply_interpolation_p16(src,local_38,&local_e8,(Option *)opt_00);
          goto LAB_005e6a87;
        }
        if (iVar4 != 2) {
          if (iVar4 == 1) {
            gridsample_2d_bilinear_apply_interpolation_p16(src,local_38,&local_e8,(Option *)opt_00);
          }
          goto LAB_005e6a87;
        }
      }
      else {
        if (iVar22 != 4) goto LAB_005e6a87;
        iVar4 = (this->super_GridSample).sample_type;
        if (iVar4 != 2) {
          if (iVar4 == 1) {
            gridsample_3d_bilinear_apply_interpolation_p16(src,local_38,&local_e8,(Option *)opt_00);
          }
          goto LAB_005e6a87;
        }
      }
      gridsample_nearest_apply_interpolation_p16(src,local_38,&local_e8,(Option *)opt_00);
      goto LAB_005e6a87;
    }
    if (iVar22 == 3) {
      iVar6 = (this->super_GridSample).sample_type;
      if (iVar6 == 3) {
        gridsample_2d_bicubic_apply_interpolation_p8(src,local_38,&local_e8,(Option *)opt_00);
      }
      else if (iVar6 == 2) {
LAB_005e6595:
        gridsample_nearest_apply_interpolation_p8(src,local_38,&local_e8,(Option *)opt_00);
      }
      else if (iVar6 == 1) {
        gridsample_2d_bilinear_apply_interpolation_p8(src,local_38,&local_e8,(Option *)opt_00);
      }
    }
    else if (iVar22 == 4) {
      iVar6 = (this->super_GridSample).sample_type;
      if (iVar6 == 2) goto LAB_005e6595;
      if (iVar6 == 1) {
        gridsample_3d_bilinear_apply_interpolation_p8(src,local_38,&local_e8,(Option *)opt_00);
      }
    }
  }
  if (iVar4 != 4) goto LAB_005e6a87;
  if (iVar22 == 3) {
    iVar4 = (this->super_GridSample).sample_type;
    if (iVar4 == 3) {
      gridsample_2d_bicubic_apply_interpolation_p4(src,dst,&local_e8,(Option *)opt_00);
      goto LAB_005e6a87;
    }
    if (iVar4 != 2) {
      if (iVar4 == 1) {
        gridsample_2d_bilinear_apply_interpolation_p4(src,dst,&local_e8,(Option *)opt_00);
      }
      goto LAB_005e6a87;
    }
  }
  else {
    if (iVar22 != 4) goto LAB_005e6a87;
    iVar4 = (this->super_GridSample).sample_type;
    if (iVar4 != 2) {
      if (iVar4 == 1) {
        gridsample_3d_bilinear_apply_interpolation_p4(src,dst,&local_e8,(Option *)opt_00);
      }
      goto LAB_005e6a87;
    }
  }
  gridsample_nearest_apply_interpolation_p4(src,dst,&local_e8,(Option *)opt_00);
LAB_005e6a87:
  piVar31 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar31 != (int *)0x0) {
    LOCK();
    *piVar31 = *piVar31 + -1;
    UNLOCK();
    if (*piVar31 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88.elemsize._4_4_ = 0;
  local_88.elempack = 0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  piVar31 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar31 != (int *)0x0) {
    LOCK();
    *piVar31 = *piVar31 + -1;
    UNLOCK();
    if (*piVar31 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if ((int *)local_e8.data != (int *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int GridSample_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}